

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sse2.c
# Opt level: O3

int GetResidualCost_SSE2(int ctx0,VP8Residual *res)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  short *psVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  uint uVar44;
  long lVar45;
  long lVar46;
  CostArrayPtr papuVar47;
  uint16_t *puVar48;
  int iVar49;
  long lVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  byte abStack_48 [4];
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  uint8_t ctxs [16];
  uint8_t levels [16];
  uint16_t abs_levels [16];
  
  iVar49 = res->first;
  lVar45 = (long)iVar49;
  bVar2 = res->prob[lVar45][ctx0][0];
  uVar44 = 0;
  if (ctx0 == 0) {
    uVar44 = (uint)VP8EntropyCost[(byte)~bVar2];
  }
  iVar3 = res->last;
  lVar50 = (long)iVar3;
  if (lVar50 < 0) {
    uVar44 = (uint)VP8EntropyCost[bVar2];
  }
  else {
    puVar48 = res->costs[lVar45][ctx0];
    psVar4 = res->coeffs;
    sVar28 = *psVar4;
    sVar29 = psVar4[1];
    sVar30 = psVar4[2];
    sVar31 = psVar4[3];
    sVar32 = psVar4[4];
    sVar33 = psVar4[5];
    sVar34 = psVar4[6];
    sVar35 = psVar4[7];
    sVar36 = psVar4[8];
    sVar37 = psVar4[9];
    sVar38 = psVar4[10];
    sVar39 = psVar4[0xb];
    sVar40 = psVar4[0xc];
    sVar41 = psVar4[0xd];
    sVar42 = psVar4[0xe];
    sVar43 = psVar4[0xf];
    sVar20 = -sVar28;
    sVar21 = -sVar29;
    sVar22 = -sVar30;
    sVar23 = -sVar31;
    sVar24 = -sVar32;
    sVar25 = -sVar33;
    sVar26 = -sVar34;
    sVar27 = -sVar35;
    auVar51._0_2_ = (ushort)(sVar20 < sVar28) * sVar28 | (ushort)(sVar20 >= sVar28) * sVar20;
    auVar51._2_2_ = (ushort)(sVar21 < sVar29) * sVar29 | (ushort)(sVar21 >= sVar29) * sVar21;
    auVar51._4_2_ = (ushort)(sVar22 < sVar30) * sVar30 | (ushort)(sVar22 >= sVar30) * sVar22;
    auVar51._6_2_ = (ushort)(sVar23 < sVar31) * sVar31 | (ushort)(sVar23 >= sVar31) * sVar23;
    auVar51._8_2_ = (ushort)(sVar24 < sVar32) * sVar32 | (ushort)(sVar24 >= sVar32) * sVar24;
    auVar51._10_2_ = (ushort)(sVar25 < sVar33) * sVar33 | (ushort)(sVar25 >= sVar33) * sVar25;
    auVar51._12_2_ = (ushort)(sVar26 < sVar34) * sVar34 | (ushort)(sVar26 >= sVar34) * sVar26;
    auVar51._14_2_ = (ushort)(sVar27 < sVar35) * sVar35 | (ushort)(sVar27 >= sVar35) * sVar27;
    sVar20 = -sVar36;
    sVar21 = -sVar37;
    sVar22 = -sVar38;
    sVar23 = -sVar39;
    sVar24 = -sVar40;
    sVar25 = -sVar41;
    sVar26 = -sVar42;
    sVar27 = -sVar43;
    auVar52._0_2_ = (ushort)(sVar20 < sVar36) * sVar36 | (ushort)(sVar20 >= sVar36) * sVar20;
    auVar52._2_2_ = (ushort)(sVar21 < sVar37) * sVar37 | (ushort)(sVar21 >= sVar37) * sVar21;
    auVar52._4_2_ = (ushort)(sVar22 < sVar38) * sVar38 | (ushort)(sVar22 >= sVar38) * sVar22;
    auVar52._6_2_ = (ushort)(sVar23 < sVar39) * sVar39 | (ushort)(sVar23 >= sVar39) * sVar23;
    auVar52._8_2_ = (ushort)(sVar24 < sVar40) * sVar40 | (ushort)(sVar24 >= sVar40) * sVar24;
    auVar52._10_2_ = (ushort)(sVar25 < sVar41) * sVar41 | (ushort)(sVar25 >= sVar41) * sVar25;
    auVar52._12_2_ = (ushort)(sVar26 < sVar42) * sVar42 | (ushort)(sVar26 >= sVar42) * sVar26;
    auVar52._14_2_ = (ushort)(sVar27 < sVar43) * sVar43 | (ushort)(sVar27 >= sVar43) * sVar27;
    auVar52 = packsswb(auVar51,auVar52);
    bVar2 = auVar52[0];
    bVar5 = auVar52[1];
    bVar6 = auVar52[2];
    bVar7 = auVar52[3];
    bVar8 = auVar52[4];
    bVar9 = auVar52[5];
    bVar10 = auVar52[6];
    bVar11 = auVar52[7];
    bVar12 = auVar52[8];
    bVar13 = auVar52[9];
    bVar14 = auVar52[10];
    bVar15 = auVar52[0xb];
    bVar16 = auVar52[0xc];
    bVar17 = auVar52[0xd];
    bVar18 = auVar52[0xe];
    bVar19 = auVar52[0xf];
    abStack_48[0] = (bVar2 < 2) * bVar2 | (bVar2 >= 2) * '\x02';
    abStack_48[1] = (bVar5 < 2) * bVar5 | (bVar5 >= 2) * '\x02';
    abStack_48[2] = (bVar6 < 2) * bVar6 | (bVar6 >= 2) * '\x02';
    abStack_48[3] = (bVar7 < 2) * bVar7 | (bVar7 >= 2) * '\x02';
    bStack_44 = (bVar8 < 2) * bVar8 | (bVar8 >= 2) * '\x02';
    bStack_43 = (bVar9 < 2) * bVar9 | (bVar9 >= 2) * '\x02';
    bStack_42 = (bVar10 < 2) * bVar10 | (bVar10 >= 2) * '\x02';
    bStack_41 = (bVar11 < 2) * bVar11 | (bVar11 >= 2) * '\x02';
    ctxs[0] = (bVar12 < 2) * bVar12 | (bVar12 >= 2) * '\x02';
    ctxs[1] = (bVar13 < 2) * bVar13 | (bVar13 >= 2) * '\x02';
    ctxs[2] = (bVar14 < 2) * bVar14 | (bVar14 >= 2) * '\x02';
    ctxs[3] = (bVar15 < 2) * bVar15 | (bVar15 >= 2) * '\x02';
    ctxs[4] = (bVar16 < 2) * bVar16 | (bVar16 >= 2) * '\x02';
    ctxs[5] = (bVar17 < 2) * bVar17 | (bVar17 >= 2) * '\x02';
    ctxs[6] = (bVar18 < 2) * bVar18 | (bVar18 >= 2) * '\x02';
    ctxs[7] = (bVar19 < 2) * bVar19 | (bVar19 >= 2) * '\x02';
    ctxs[8] = (0x43 < bVar2) * 'C' | (0x43 >= bVar2) * bVar2;
    ctxs[9] = (0x43 < bVar5) * 'C' | (0x43 >= bVar5) * bVar5;
    ctxs[10] = (0x43 < bVar6) * 'C' | (0x43 >= bVar6) * bVar6;
    ctxs[0xb] = (0x43 < bVar7) * 'C' | (0x43 >= bVar7) * bVar7;
    ctxs[0xc] = (0x43 < bVar8) * 'C' | (0x43 >= bVar8) * bVar8;
    ctxs[0xd] = (0x43 < bVar9) * 'C' | (0x43 >= bVar9) * bVar9;
    ctxs[0xe] = (0x43 < bVar10) * 'C' | (0x43 >= bVar10) * bVar10;
    ctxs[0xf] = (0x43 < bVar11) * 'C' | (0x43 >= bVar11) * bVar11;
    lVar46 = lVar45;
    if (iVar49 < iVar3) {
      papuVar47 = res->costs + lVar45;
      do {
        papuVar47 = papuVar47 + 1;
        pbVar1 = abStack_48 + lVar45;
        uVar44 = (uint)puVar48[ctxs[lVar45 + 8]] +
                 VP8LevelFixedCosts[abs_levels[lVar45 + -4]] + uVar44;
        lVar45 = lVar45 + 1;
        puVar48 = (*papuVar47)[*pbVar1];
        lVar46 = lVar50;
        iVar49 = iVar3;
      } while (lVar50 != lVar45);
    }
    uVar44 = (uint)puVar48[ctxs[lVar46 + 8]] + VP8LevelFixedCosts[abs_levels[lVar46 + -4]] + uVar44;
    if (iVar49 < 0xf) {
      uVar44 = uVar44 + VP8EntropyCost
                        [*(byte *)((long)*res->prob +
                                  (ulong)abStack_48[lVar46] * 0xb +
                                  (ulong)""[(long)iVar49 + 1] * 0x20 + (ulong)""[(long)iVar49 + 1])]
      ;
    }
  }
  return uVar44;
}

Assistant:

static int GetResidualCost_SSE2(int ctx0, const VP8Residual* const res) {
  uint8_t levels[16], ctxs[16];
  uint16_t abs_levels[16];
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const int p0 = res->prob[n][ctx0][0];
  CostArrayPtr const costs = res->costs;
  const uint16_t* t = costs[n][ctx0];
  // bit_cost(1, p0) is already incorporated in t[] tables, but only if ctx != 0
  // (as required by the syntax). For ctx0 == 0, we need to add it here or it'll
  // be missing during the loop.
  int cost = (ctx0 == 0) ? VP8BitCost(1, p0) : 0;

  if (res->last < 0) {
    return VP8BitCost(0, p0);
  }

  {   // precompute clamped levels and contexts, packed to 8b.
    const __m128i zero = _mm_setzero_si128();
    const __m128i kCst2 = _mm_set1_epi8(2);
    const __m128i kCst67 = _mm_set1_epi8(MAX_VARIABLE_LEVEL);
    const __m128i c0 = _mm_loadu_si128((const __m128i*)&res->coeffs[0]);
    const __m128i c1 = _mm_loadu_si128((const __m128i*)&res->coeffs[8]);
    const __m128i D0 = _mm_sub_epi16(zero, c0);
    const __m128i D1 = _mm_sub_epi16(zero, c1);
    const __m128i E0 = _mm_max_epi16(c0, D0);   // abs(v), 16b
    const __m128i E1 = _mm_max_epi16(c1, D1);
    const __m128i F = _mm_packs_epi16(E0, E1);
    const __m128i G = _mm_min_epu8(F, kCst2);    // context = 0,1,2
    const __m128i H = _mm_min_epu8(F, kCst67);   // clamp_level in [0..67]

    _mm_storeu_si128((__m128i*)&ctxs[0], G);
    _mm_storeu_si128((__m128i*)&levels[0], H);

    _mm_storeu_si128((__m128i*)&abs_levels[0], E0);
    _mm_storeu_si128((__m128i*)&abs_levels[8], E1);
  }
  for (; n < res->last; ++n) {
    const int ctx = ctxs[n];
    const int level = levels[n];
    const int flevel = abs_levels[n];   // full level
    cost += VP8LevelFixedCosts[flevel] + t[level];  // simplified VP8LevelCost()
    t = costs[n + 1][ctx];
  }
  // Last coefficient is always non-zero
  {
    const int level = levels[n];
    const int flevel = abs_levels[n];
    assert(flevel != 0);
    cost += VP8LevelFixedCosts[flevel] + t[level];
    if (n < 15) {
      const int b = VP8EncBands[n + 1];
      const int ctx = ctxs[n];
      const int last_p0 = res->prob[b][ctx][0];
      cost += VP8BitCost(0, last_p0);
    }
  }
  return cost;
}